

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

Ssw_Cla_t * Ssw_ClassesPrepareTargets(Aig_Man_t *pAig)

{
  int iVar1;
  Ssw_Cla_t *pSVar2;
  Aig_Obj_t **ppAVar3;
  long lVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  
  pSVar2 = Ssw_ClassesStart(pAig);
  pSVar2->nCands1 = 0;
  iVar1 = pAig->nTruePos;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if (pAig->vCos->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = *(ulong *)((long)pAig->vCos->pArray[lVar4] + 8) & 0xfffffffffffffffe;
      ppAVar3 = pAig->pReprs;
      if (ppAVar3 == (Aig_Obj_t **)0x0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = ppAVar3[*(int *)(uVar5 + 0x24)];
      }
      if (pAVar6 == pAig->pConst1) {
        __assert_fail("!Ssw_ObjIsConst1Cand( pAig, pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswInt.h"
                      ,0xb2,"void Ssw_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
      }
      if (ppAVar3 == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      ppAVar3[*(int *)(uVar5 + 0x24)] = pAig->pConst1;
      pSVar2->nCands1 = pSVar2->nCands1 + 1;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  ppAVar3 = (Aig_Obj_t **)malloc((long)pSVar2->nCands1 << 3);
  pSVar2->pMemClasses = ppAVar3;
  pSVar2->pMemClassesFree = ppAVar3;
  return pSVar2;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareTargets( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // go through the nodes
    p->nCands1 = 0;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        Ssw_ObjSetConst1Cand( pAig, Aig_ObjFanin0(pObj) );
        p->nCands1++;
    }
    // allocate room for classes
    p->pMemClassesFree = p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, p->nCands1 );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}